

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::Rc<kj::Refcounted>_>::~ExceptionOr
          (ExceptionOr<kj::Rc<kj::Refcounted>_> *this)

{
  Refcounted *pRVar1;
  Disposer *pDVar2;
  
  if (((this->value).ptr.isSet == true) &&
     (pRVar1 = (this->value).ptr.field_1.value.own.ptr, pRVar1 != (Refcounted *)0x0)) {
    (this->value).ptr.field_1.value.own.ptr = (Refcounted *)0x0;
    pDVar2 = (this->value).ptr.field_1.value.own.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pRVar1->super_Disposer)._vptr_Disposer[-2] +
                      (long)&(pRVar1->super_Disposer)._vptr_Disposer);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}